

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int handle_hello_retry_request
              (ptls_t *tls,ptls_message_emitter_t *emitter,st_ptls_server_hello_t *sh,
              ptls_iovec_t message,ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  uint8_t *puVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  ptls_key_exchange_context_t *ppVar5;
  st_ptls_aead_context_t *__ptr;
  ptls_key_exchange_algorithm_t *ppVar6;
  int iVar7;
  ptls_key_exchange_algorithm_t **pppVar8;
  bool bVar9;
  
  ppVar5 = (tls->field_19).client.key_share_ctx;
  if (ppVar5 != (ptls_key_exchange_context_t *)0x0) {
    pppVar1 = &(tls->field_19).client.key_share_ctx;
    (*ppVar5->on_exchange)(pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
    *pppVar1 = (ptls_key_exchange_context_t *)0x0;
  }
  if (((tls->field_19).server.pending_traffic_secret[0x38] & 2) != 0) {
    if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0) {
      __ptr = (tls->traffic_protection).enc.aead;
      if (__ptr == (st_ptls_aead_context_t *)0x0) {
        __assert_fail("tls->traffic_protection.enc.aead != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0xabb,
                      "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      (*__ptr->dispose_crypto)(__ptr);
      free(__ptr);
      (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
    }
    puVar2 = (tls->field_19).server.pending_traffic_secret + 0x38;
    *puVar2 = *puVar2 & 0xfd;
  }
  uVar3 = (sh->field_3).retry_request.selected_group;
  if (uVar3 == 0xffff) {
    if (tls->key_share != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00115552:
      iVar7 = send_client_hello(tls,emitter,(ptls_handshake_properties_t *)message.base,
                                &(sh->field_3).retry_request.cookie);
      return iVar7;
    }
  }
  else {
    pppVar8 = tls->ctx->key_exchanges;
    ppVar6 = *pppVar8;
    bVar9 = ppVar6 == (ptls_key_exchange_algorithm_t *)0x0;
    if (!bVar9) {
      uVar4 = ppVar6->id;
      while (uVar4 != uVar3) {
        pppVar8 = pppVar8 + 1;
        ppVar6 = *pppVar8;
        bVar9 = ppVar6 == (ptls_key_exchange_algorithm_t *)0x0;
        if (bVar9) {
          return 0x2f;
        }
        uVar4 = ppVar6->id;
      }
      if (!bVar9) {
        tls->key_share = ppVar6;
        goto LAB_00115552;
      }
    }
  }
  return 0x2f;
}

Assistant:

static int handle_hello_retry_request(ptls_t *tls, ptls_message_emitter_t *emitter, struct st_ptls_server_hello_t *sh,
                                      ptls_iovec_t message, ptls_handshake_properties_t *properties)
{
    int ret;

    if (tls->client.key_share_ctx != NULL) {
        tls->client.key_share_ctx->on_exchange(&tls->client.key_share_ctx, 1, NULL, ptls_iovec_init(NULL, 0));
        tls->client.key_share_ctx = NULL;
    }
    if (tls->client.using_early_data) {
        /* release traffic encryption key so that 2nd CH goes out in cleartext, but keep the epoch at 1 since we've already
         * called derive-secret */
        if (tls->ctx->update_traffic_key == NULL) {
            assert(tls->traffic_protection.enc.aead != NULL);
            ptls_aead_free(tls->traffic_protection.enc.aead);
            tls->traffic_protection.enc.aead = NULL;
        }
        tls->client.using_early_data = 0;
    }

    if (sh->retry_request.selected_group != UINT16_MAX) {
        /* we offer the first key_exchanges[0] as KEY_SHARE unless client.negotiate_before_key_exchange is set */
        ptls_key_exchange_algorithm_t **cand;
        for (cand = tls->ctx->key_exchanges; *cand != NULL; ++cand)
            if ((*cand)->id == sh->retry_request.selected_group)
                break;
        if (*cand == NULL) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        tls->key_share = *cand;
    } else if (tls->key_share != NULL) {
        /* retain the key-share using in first CH, if server does not specify one */
    } else {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    ret = send_client_hello(tls, emitter, properties, &sh->retry_request.cookie);

Exit:
    return ret;
}